

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

void fnode_service_release(fnode_service_t *svc)

{
  ulong uVar1;
  
  if (((svc != (fnode_service_t *)0x0) && (svc->ref_counter != 0)) &&
     (svc->ref_counter = svc->ref_counter + -1, svc->ref_counter == 0)) {
    if (svc->ifaces_num != 0) {
      uVar1 = 0;
      do {
        fnet_socket_close(svc->ifaces[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < svc->ifaces_num);
    }
    fnet_socket_uninit();
    free(svc);
    return;
  }
  return;
}

Assistant:

void fnode_service_release(fnode_service_t *svc)
{
    if (svc)
    {
        if (!svc->ref_counter)
            FLOG_ERR("Invalid interlink");
        else if (!--svc->ref_counter)
        {
            fnode_service_close_iface_sockets(svc);
            fnet_socket_uninit();
            memset(svc, 0, sizeof *svc);
            free(svc);
        }
    }
    else
        FLOG_ERR("Invalid interlink");
}